

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest_shouldRejectRequestWithoutAuthorization_Test::
TestBody(BasicAuthIntegrationTest_shouldRejectRequestWithoutAuthorization_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_90;
  Message local_88 [3];
  int local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  Response metrics;
  BasicAuthIntegrationTest_shouldRejectRequestWithoutAuthorization_Test *this_local;
  
  IntegrationTest::FetchMetrics
            ((Response *)&gtest_ar.message_,(IntegrationTest *)this,
             &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.default_metrics_path_);
  local_6c = 0x191;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_68,"metrics.code","401",(long *)&gtest_ar.message_,&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_88);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
               ,0xf0,message);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  IntegrationTest::Response::~Response((Response *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(BasicAuthIntegrationTest, shouldRejectRequestWithoutAuthorization) {
  const auto metrics = FetchMetrics(default_metrics_path_);
  ASSERT_EQ(metrics.code, 401);
}